

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O2

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
parse_mods_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  source_location local_88;
  regex_error local_70;
  
  uVar7 = 1;
  do {
    pcVar2 = *begin;
    cVar1 = *pcVar2;
    if (cVar1 == '-') {
      if (uVar7 == 0) {
LAB_001207c3:
        regex_error::regex_error(&local_70,error_paren,"unknown pattern modifier");
        local_88.file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
        ;
        local_88.function_ =
             "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::parse_mods_(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
        ;
        local_88.line_ = 0x191;
        local_88.column_ = 0;
        throw_exception<boost::xpressive::regex_error>(&local_70,&local_88);
      }
      uVar7 = (uint)(byte)((byte)uVar7 ^ 1);
    }
    else {
      if (cVar1 == 'i') {
        uVar4 = (*(uint *)(this + 0x210) & 0xfffffffd) + uVar7 * 2;
      }
      else {
        bVar6 = ~(byte)uVar7;
        if (cVar1 == 'm') {
          uVar5 = *(uint *)(this + 0x210) & 0xfffffbff;
          uVar4 = (bVar6 & 1) << 10;
        }
        else if (cVar1 == 's') {
          uVar5 = *(uint *)(this + 0x210) & 0xffffefff;
          uVar4 = (bVar6 & 1) << 0xc;
        }
        else {
          if (cVar1 != 'x') {
            if (cVar1 == ')') {
              return token_no_mark;
            }
            if (cVar1 == ':') {
              *begin = pcVar2 + 1;
              return token_no_mark;
            }
            goto LAB_001207c3;
          }
          uVar5 = *(uint *)(this + 0x210) & 0xffffdfff;
          uVar4 = uVar7 << 0xd;
        }
        uVar4 = uVar4 | uVar5;
      }
      *(uint *)(this + 0x210) = uVar4;
    }
    *begin = pcVar2 + 1;
    bVar3 = detail::ensure_(pcVar2 + 1 != end,error_paren,"incomplete extension",
                            "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::parse_mods_(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                            ,0x193);
    if (!bVar3) {
      return token_no_mark;
    }
  } while( true );
}

Assistant:

regex_constants::compiler_token_type parse_mods_(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        bool localset = true;
        do switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, 'i'): this->flag_(localset, icase_); break;
        case BOOST_XPR_CHAR_(char_type, 'm'): this->flag_(!localset, single_line); break;
        case BOOST_XPR_CHAR_(char_type, 's'): this->flag_(!localset, not_dot_newline); break;
        case BOOST_XPR_CHAR_(char_type, 'x'): this->flag_(localset, ignore_white_space); break;
        case BOOST_XPR_CHAR_(char_type, ':'): ++begin; BOOST_FALLTHROUGH;
        case BOOST_XPR_CHAR_(char_type, ')'): return token_no_mark;
        case BOOST_XPR_CHAR_(char_type, '-'): if(false == (localset = !localset)) break; BOOST_FALLTHROUGH;
        default: BOOST_THROW_EXCEPTION(regex_error(error_paren, "unknown pattern modifier"));
        }
        while(BOOST_XPR_ENSURE_(++begin != end, error_paren, "incomplete extension"));
        // this return is technically unreachable, but this must
        // be here to work around a bug in gcc 4.0
        return token_no_mark;
    }